

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attentional.cc
# Opt level: O3

void test_kbest_arcs<dynet::AttentionalModel<dynet::LSTMBuilder>>
               (Model *model,AttentionalModel<dynet::LSTMBuilder> *am,string *test_file,uint top_k)

{
  undefined1 auVar1 [16];
  char cVar2;
  int iVar3;
  ostream *poVar4;
  istream *piVar5;
  ulong uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  items;
  Sentence target;
  Sentence source;
  uint count;
  uint snum;
  string word;
  string id;
  string sep;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  last_items;
  string last_id;
  anon_class_40_5_ba08fbfd process;
  string line;
  istringstream in_1;
  ifstream in;
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  local_558;
  vector<int,_std::allocator<int>_> local_538;
  vector<int,_std::allocator<int>_> local_518;
  int local_4fc [3];
  string local_4f0;
  undefined8 local_4d0;
  size_t local_4c8;
  undefined1 local_4c0 [16];
  ulong local_4b0;
  undefined1 *local_4a8;
  size_t local_4a0;
  undefined1 local_498 [16];
  vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  local_488;
  undefined1 *local_468;
  size_t local_460;
  undefined1 local_458 [16];
  anon_class_40_5_ba08fbfd local_448;
  string *local_420;
  vector<int,_std::allocator<int>_> local_418;
  void *local_3f8;
  undefined1 *local_3d8;
  undefined8 local_3d0;
  undefined1 local_3c8 [16];
  tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
  local_3b8 [2];
  ios_base local_340 [264];
  long local_238 [4];
  byte abStack_218 [488];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Reading test examples from ",0x1b);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(test_file->_M_dataplus)._M_p,
                      test_file->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::ifstream::ifstream(local_238,(string *)test_file,_S_in);
  if ((abStack_218[*(long *)(local_238[0] + -0x18)] & 5) != 0) {
    __assert_fail("in",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/src/attentional.cc"
                  ,0x166,
                  "void test_kbest_arcs(Model &, AM_t &, string, unsigned int) [AM_t = dynet::AttentionalModel<dynet::LSTMBuilder>]"
                 );
  }
  local_3d8 = local_3c8;
  local_468 = local_458;
  local_3d0 = 0;
  local_3c8[0] = 0;
  local_4a8 = local_498;
  local_460 = 0;
  local_458[0] = 0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4a8,"|||","");
  local_558.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_488.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_558.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_558.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_488.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_488.
  super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4d0 = (undefined1 *)CONCAT44(kSRC_EOS,kSRC_SOS);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_4d0;
  std::vector<int,_std::allocator<int>_>::vector(&local_418,__l,(allocator_type *)&local_518);
  local_4f0._M_dataplus._M_p._4_4_ = kTGT_EOS;
  local_4f0._M_dataplus._M_p._0_4_ = kTGT_SOS;
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)&local_4f0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_448,__l_00,(allocator_type *)&local_538);
  local_3b8[0].
  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
  .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_3b8[0].
  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
  .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  auVar1 = CONCAT88(local_448.snum,local_448.am);
  local_448.am = (AttentionalModel<dynet::LSTMBuilder> *)0x0;
  local_448.snum = (uint *)0x0;
  local_3b8[0].
  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
  .super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.super__Tuple_impl<2UL,_int>.
  super__Head_base<2UL,_int,_false>._M_head_impl = (_Head_base<2UL,_int,_false>)-1;
  auVar7._8_8_ = local_448.last_items;
  auVar7._0_8_ = local_448.last_items;
  auVar7._16_8_ = local_448.last_items;
  auVar7._24_8_ = local_448.last_items;
  local_448.last_items =
       (vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
        *)0x0;
  auVar7 = vblendps_avx(ZEXT1632(auVar1),auVar7,0x30);
  auVar8._8_8_ = local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  auVar8._0_8_ = local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
  auVar8._16_8_ =
       local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  auVar8._24_8_ =
       local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_3b8[0].
  super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
  ._8_32_ = vblendps_avx(auVar7,auVar8,0xc0);
  local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::
  vector<std::tuple<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>,std::allocator<std::tuple<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>>>
  ::
  emplace_back<std::tuple<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>>
            ((vector<std::tuple<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>,std::allocator<std::tuple<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>>>
              *)&local_488,local_3b8);
  if (local_3b8[0].
      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
      .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_3b8[0].
                    super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                    .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>.
                    _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3b8[0].
      super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
      .super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
      super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_3b8[0].
                    super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                    .super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>.
                    super__Head_base<1UL,_std::vector<int,_std::allocator<int>_>,_false>.
                    _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_448.am != (AttentionalModel<dynet::LSTMBuilder> *)0x0) {
    operator_delete(local_448.am);
  }
  local_420 = test_file;
  if (local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_448.snum = (uint *)(local_4fc + 2);
  local_448.count = (uint *)(local_4fc + 1);
  local_4fc[2] = 0;
  local_448.last_items = &local_488;
  local_4fc[1] = 0;
  local_448.items = &local_558;
  local_4b0 = (ulong)top_k;
  local_448.am = am;
  do {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + (char)(istream *)local_238
                           );
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_3d8,cVar2);
    if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) {
      if (local_558.
          super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_558.
          super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        test_kbest_arcs<dynet::AttentionalModel<dynet::LSTMBuilder>_>::anon_class_40_5_ba08fbfd::
        operator()(&local_448);
      }
      std::
      vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
      ::~vector(&local_488);
      std::
      vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
      ::~vector(&local_558);
      if (local_4a8 != local_498) {
        operator_delete(local_4a8);
      }
      if (local_468 != local_458) {
        operator_delete(local_468);
      }
      if (local_3d8 != local_3c8) {
        operator_delete(local_3d8);
      }
      std::ifstream::~ifstream(local_238);
      return;
    }
    local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (int *)0x0;
    local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (int *)0x0;
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_3b8,(string *)&local_3d8,_S_in);
    local_4d0 = local_4c0;
    local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
    local_4c8 = 0;
    local_4f0._M_string_length = 0;
    local_4c0[0] = 0;
    local_4f0.field_2._M_local_buf[0] = '\0';
    piVar5 = std::operator>>((istream *)local_3b8,(string *)&local_4d0);
    std::operator>>(piVar5,(string *)&local_4f0);
    if (local_4f0._M_string_length != local_4a0) {
LAB_001378f7:
      __assert_fail("word == sep",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/src/attentional.cc"
                    ,0x191,
                    "void test_kbest_arcs(Model &, AM_t &, string, unsigned int) [AM_t = dynet::AttentionalModel<dynet::LSTMBuilder>]"
                   );
    }
    if (local_4f0._M_string_length != 0) {
      iVar3 = bcmp(local_4f0._M_dataplus._M_p,local_4a8,local_4f0._M_string_length);
      if (iVar3 != 0) goto LAB_001378f7;
    }
    while ((*(byte *)((long)&local_3b8[0].
                             super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                             .super__Head_base<0UL,_std::vector<int,_std::allocator<int>_>,_false>.
                             _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl +
                     *(long *)(CONCAT44(local_3b8[0].
                                        super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                                        .
                                        super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>
                                        ._4_4_,local_3b8[0].
                                               super__Tuple_impl<0UL,_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                                               .
                                               super__Tuple_impl<1UL,_std::vector<int,_std::allocator<int>_>,_int>
                                               .super__Tuple_impl<2UL,_int>.
                                               super__Head_base<2UL,_int,_false>._M_head_impl) +
                              -0x18)) & 5) == 0) {
      std::operator>>((istream *)local_3b8,(string *)&local_4f0);
      if (local_4f0._M_string_length == 0) break;
      if (local_4f0._M_string_length == local_4a0) {
        iVar3 = bcmp(local_4f0._M_dataplus._M_p,local_4a8,local_4f0._M_string_length);
        if (iVar3 == 0) break;
      }
      iVar3 = dynet::Dict::convert(&sd,&local_4f0);
      local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = iVar3;
      if (local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_518,
                   (iterator)
                   local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_418);
      }
      else {
        *local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar3;
        local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar3 = dynet::Dict::convert(&td,&local_4f0);
      local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,iVar3);
      if (local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_538,
                   (iterator)
                   local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_418);
      }
      else {
        *local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar3;
        local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    if (((*local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start != kSRC_SOS) &&
        (local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish[-1] != kSRC_EOS)) ||
       ((*local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != kTGT_SOS &&
        (local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish[-1] != kTGT_EOS)))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Sentence in ",0xc);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(local_420->_M_dataplus)._M_p,
                          local_420->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4," didn\'t start or end with <s>, </s>\n");
      abort();
    }
    if (local_4c8 == local_460) {
      if (local_4c8 != 0) {
        iVar3 = bcmp(local_4d0,local_468,local_4c8);
        if (iVar3 != 0) goto LAB_0013767c;
      }
    }
    else {
LAB_0013767c:
      if (local_558.
          super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_558.
          super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        uVar6 = ((long)local_558.
                       super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_558.
                       super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
        if (local_4b0 <= uVar6 && uVar6 - local_4b0 != 0) {
          std::
          vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
          ::resize(&local_558,local_4b0);
        }
        test_kbest_arcs<dynet::AttentionalModel<dynet::LSTMBuilder>_>::anon_class_40_5_ba08fbfd::
        operator()(&local_448);
        std::
        vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
        ::operator=(&local_488,&local_558);
        std::__cxx11::string::_M_assign((string *)&local_468);
        std::
        vector<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
        ::_M_erase_at_end(&local_558,
                          local_558.
                          super__Vector_base<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>,_std::allocator<std::tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        local_4fc[2] = local_4fc[2] + 1;
        if (verbose == true) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"chug ",5);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," [",2);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4," pairs]\r",8);
          std::ostream::flush();
        }
      }
    }
    std::__cxx11::string::_M_assign((string *)&local_468);
    local_4fc[0] = -1;
    std::
    _Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>::
    _Tuple_impl<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,int,void>
              ((_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>
                *)&local_418,&local_518,&local_538,local_4fc);
    std::
    vector<std::tuple<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>,std::allocator<std::tuple<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>>>
    ::
    emplace_back<std::tuple<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>>
              ((vector<std::tuple<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>,std::allocator<std::tuple<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,int>>>
                *)&local_558,
               (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_int>
                *)&local_418);
    if (local_3f8 != (void *)0x0) {
      operator_delete(local_3f8);
    }
    if (local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish != (pointer)0x0) {
      operator_delete(local_418.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      operator_delete(local_4f0._M_dataplus._M_p);
    }
    if (local_4d0 != local_4c0) {
      operator_delete(local_4d0);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
    std::ios_base::~ios_base(local_340);
    if (local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_538.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_518.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  } while( true );
}

Assistant:

void test_kbest_arcs(Model &model, AM_t &am, string test_file, unsigned top_k)
{
    // only suitable for monolingual setting, of predicting a sentence given preceeding sentence
    cerr << "Reading test examples from " << test_file << endl;
    unsigned lno = 0;
    ifstream in(test_file);
    assert(in);
    string line, last_id;
    const std::string sep = "|||";
    vector<SentencePair> items, last_items;
    last_items.push_back(SentencePair(Sentence({ kSRC_SOS, kSRC_EOS }), Sentence({ kTGT_SOS, kTGT_EOS }), -1));
    unsigned snum = 0;
    unsigned count = 0;

    auto process = [&am, &snum, &last_items, &items, &count]() {
        for (unsigned i = 0; i < last_items.size(); ++i) {
            ComputationGraph cg;
            auto &source = get<0>(last_items[i]);
            am.start_new_instance(source, cg);

            for (unsigned j = 0; j < items.size(); ++j) {
                std::vector<Expression> errs;
                auto &target = get<1>(items[j]);
                const unsigned tlen = target.size() - 1;
                for (unsigned t = 0; t < tlen; ++t) {
                    Expression i_r_t = am.add_input(target[t], t, cg);
                    Expression i_err = pickneglogsoftmax(i_r_t, target[t+1]);
                    errs.push_back(i_err);
                }
                Expression i_nerr = sum(errs);
                double loss = as_scalar(cg.incremental_forward(i_nerr));

                //cout << last_last_id << ":" << last_id << " |||";
                //for (auto &w: source) cout << " " << sd.convert(w);
                //cout << " |||";
                //for (auto &w: target) cout << " " << td.convert(w);
                //cout << " ||| " << loss << "\n";
                cout << snum << '\t' << i << '\t' << j << '\t' << loss << '\n';
                ++count;
            }
        }
    };

    while (getline(in, line)) {
	Sentence source, target;

	istringstream in(line);
	string id, word;
	in >> id >> word;
	assert(word == sep);
	while(in) {
	    in >> word;
	    if (word.empty() || word == sep) break;
	    source.push_back(sd.convert(word));
	    target.push_back(td.convert(word));
	}

	if ((source.front() != kSRC_SOS && source.back() != kSRC_EOS) ||
		(target.front() != kTGT_SOS && target.back() != kTGT_EOS)) {
	    cerr << "Sentence in " << test_file << ":" << lno << " didn't start or end with <s>, </s>\n";
	    abort();
	}

	if (id != last_id && !items.empty()) {
	    if (items.size() > top_k)
		items.resize(top_k);

            process();

	    last_items = items;
	    last_id = id;
	    items.clear();
            snum++;

	    if (verbose)
		cerr << "chug " << lno++ << " [" << count << " pairs]\r" << flush;
	}

	last_id = id;
	items.push_back(SentencePair(source, target, -1));
    }
    
    if (!items.empty())
        process();

    return;
}